

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBad.cpp
# Opt level: O2

void __thiscall L12_1::StringBad::~StringBad(StringBad *this)

{
  std::operator<<((ostream *)&std::cout,"\"");
}

Assistant:

StringBad::~StringBad() {
        std::cout << "\"" << str << "\" object deleted. " << num_strings - 1 << " left.\n";
        num_strings--;
        //  清掉动态分配的内存
        delete [] str;
    }